

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall KktCheck::chComplementarySlackness(KktCheck *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  ostream *poVar6;
  int iVar7;
  
  this->i = 0;
  if (0 < this->numCol) {
    iVar7 = 0;
    bVar5 = true;
    do {
      dVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      if (-1e+200 < dVar2) {
        dVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        dVar4 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        if (this->tol < ABS((dVar3 - dVar2) * dVar4)) {
          pdVar1 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar7;
          if (((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) && (this->tol < ABS(dVar4))) {
            if (this->print == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Comp. slackness fail: ",0x16);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"l[",2);
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]=",2);
              poVar6 = std::ostream::_M_insert<double>
                                 ((this->colLower).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", x[",4);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]=",2);
              poVar6 = std::ostream::_M_insert<double>
                                 ((this->colValue).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", z[",4);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]=",2);
              poVar6 = std::ostream::_M_insert<double>
                                 ((this->colDual).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
            }
            bVar5 = false;
          }
        }
      }
      iVar7 = this->i;
      dVar2 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      if (dVar2 < 1e+200) {
        dVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        dVar4 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        if (this->tol < ABS((dVar2 - dVar3) * dVar4)) {
          pdVar1 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar7;
          if (((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) && (this->tol < ABS(dVar4))) {
            if (this->print == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Comp. slackness fail: x[",0x18);
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]=",2);
              poVar6 = std::ostream::_M_insert<double>
                                 ((this->colValue).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", u[",4);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]=",2);
              poVar6 = std::ostream::_M_insert<double>
                                 ((this->colUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", z[",4);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]=",2);
              poVar6 = std::ostream::_M_insert<double>
                                 ((this->colDual).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
            }
            bVar5 = false;
          }
        }
      }
      iVar7 = this->i + 1;
      this->i = iVar7;
    } while (iVar7 < this->numCol);
    if (!bVar5) {
      if (this->print == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"KKT check error: Comp slackness fail.\n",0x26);
      }
      this->istrueGlb = true;
      return;
    }
  }
  if (this->print != 1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Complementary Slackness.\n",0x19);
  return;
}

Assistant:

void KktCheck::chComplementarySlackness() {
	bool istrue = true;
	
	for (i=0; i<numCol;i++) {
		if (colLower[i] > -HSOL_CONST_INF)  
			if (abs( (colValue[i]- colLower[i])*(colDual[i]) ) > tol && colValue[i]!=colUpper[i] && abs(colDual[i])> tol) {
				if (print == 1) 
					cout<<"Comp. slackness fail: "<<"l["<<cIndexRev[i]<<"]="<<colLower[i]<<", x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Comp. slackness fail: "<<"l["<<i<<"]="<<colLower[i]<<", x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		if (colUpper[i] < HSOL_CONST_INF) 
			if (abs( (colUpper[i] - colValue[i])*(colDual[i]) )> tol && colValue[i]!=colLower[i] && abs(colDual[i])> tol) {
				if (print == 1) 
					cout<<"Comp. slackness fail: x["<<cIndexRev[i]<<"]="<<colValue[i]<<", u["<<i<<"]="<<colUpper[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Comp. slackness fail: x["<<i<<"]="<<colValue[i]<<", u["<<i<<"]="<<colUpper[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Complementary Slackness.\n";}
	else {
		if (print == 1) 
			cout<<"KKT check error: Comp slackness fail.\n";
		istrueGlb = true;
	}
}